

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LennardJonesAtomTypesSectionParser.cpp
# Opt level: O3

void __thiscall
OpenMD::LennardJonesAtomTypesSectionParser::LennardJonesAtomTypesSectionParser
          (LennardJonesAtomTypesSectionParser *this,ForceFieldOptions *options)

{
  long *local_40 [2];
  long local_30 [2];
  
  (this->super_SectionParser).sectionName_._M_dataplus._M_p =
       (pointer)&(this->super_SectionParser).sectionName_.field_2;
  (this->super_SectionParser).sectionName_._M_string_length = 0;
  (this->super_SectionParser).sectionName_.field_2._M_local_buf[0] = '\0';
  (this->super_SectionParser)._vptr_SectionParser = (_func_int **)&PTR__SectionParser_0024fc78;
  this->options_ = options;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"LennardJonesAtomTypes","");
  std::__cxx11::string::_M_assign((string *)&(this->super_SectionParser).sectionName_);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

LennardJonesAtomTypesSectionParser::LennardJonesAtomTypesSectionParser(
      ForceFieldOptions& options) :
      options_(options) {
    setSectionName("LennardJonesAtomTypes");
  }